

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cc
# Opt level: O2

bool __thiscall
flow::lang::Interpreter::compile
          (Interpreter *this,Parser *parser,Report *report,int optimizationLevel)

{
  undefined8 uVar1;
  int iVar2;
  byte bVar3;
  unique_ptr<flow::Program,_std::default_delete<flow::Program>_> program;
  unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_> programIR;
  PassManager pm;
  IRGenerator irgen;
  undefined1 local_598 [16];
  pointer local_588;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  code *local_4a0 [2];
  code *local_490;
  code *local_488;
  code *local_480 [2];
  code *local_470;
  code *local_468;
  code *local_460 [2];
  code *local_450;
  code *local_448;
  code *local_440 [2];
  code *local_430;
  code *local_428;
  code *local_420 [2];
  code *local_410;
  code *local_408;
  code *local_400 [2];
  code *local_3f0;
  code *local_3e8;
  code *local_3e0 [2];
  code *local_3d0;
  code *local_3c8;
  TargetCodeGenerator local_3c0;
  IRGenerator local_108;
  
  Parser::parse((Parser *)&local_588);
  iVar2 = (*report->_vptr_Report[3])(report);
  if ((char)iVar2 == '\0') {
    IRGenerator::IRGenerator(&local_108,report);
    IRGenerator::generate((IRGenerator *)(local_598 + 8),(UnitSym *)&local_108);
    if (0 < optimizationLevel) {
      local_3c0.super_InstructionVisitor._vptr_InstructionVisitor = (_func_int **)&local_3c0;
      local_3c0.errors_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3c0.errors_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_3c0.super_InstructionVisitor._vptr_InstructionVisitor;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c0,"eliminate-empty-blocks",(allocator<char> *)local_598);
      local_3e0[1] = (code *)0x0;
      local_3e0[0] = transform::emptyBlockElimination;
      local_3c8 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
                  _M_invoke;
      local_3d0 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
                  _M_manager;
      PassManager::registerPass((PassManager *)&local_3c0,&local_4c0,(HandlerPass *)local_3e0);
      std::_Function_base::~_Function_base((_Function_base *)local_3e0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e0,"eliminate-linear-br",(allocator<char> *)local_598);
      local_400[1] = (code *)0x0;
      local_400[0] = transform::eliminateLinearBr;
      local_3e8 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
                  _M_invoke;
      local_3f0 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
                  _M_manager;
      PassManager::registerPass((PassManager *)&local_3c0,&local_4e0,(HandlerPass *)local_400);
      std::_Function_base::~_Function_base((_Function_base *)local_400);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_500,"eliminate-unused-blocks",(allocator<char> *)local_598);
      local_420[1] = (code *)0x0;
      local_420[0] = transform::eliminateUnusedBlocks;
      local_408 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
                  _M_invoke;
      local_410 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
                  _M_manager;
      PassManager::registerPass((PassManager *)&local_3c0,&local_500,(HandlerPass *)local_420);
      std::_Function_base::~_Function_base((_Function_base *)local_420);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_520,"eliminate-unused-instr",(allocator<char> *)local_598);
      local_440[1] = (code *)0x0;
      local_440[0] = transform::eliminateUnusedInstr;
      local_428 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
                  _M_invoke;
      local_430 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
                  _M_manager;
      PassManager::registerPass((PassManager *)&local_3c0,&local_520,(HandlerPass *)local_440);
      std::_Function_base::~_Function_base((_Function_base *)local_440);
      std::__cxx11::string::~string((string *)&local_520);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_540,"fold-constant-condbr",(allocator<char> *)local_598);
      local_460[1] = (code *)0x0;
      local_460[0] = transform::foldConstantCondBr;
      local_448 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
                  _M_invoke;
      local_450 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
                  _M_manager;
      PassManager::registerPass((PassManager *)&local_3c0,&local_540,(HandlerPass *)local_460);
      std::_Function_base::~_Function_base((_Function_base *)local_460);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_560,"rewrite-br-to-exit",(allocator<char> *)local_598);
      local_480[1] = (code *)0x0;
      local_480[0] = transform::rewriteBrToExit;
      local_468 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
                  _M_invoke;
      local_470 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
                  _M_manager;
      PassManager::registerPass((PassManager *)&local_3c0,&local_560,(HandlerPass *)local_480);
      std::_Function_base::~_Function_base((_Function_base *)local_480);
      std::__cxx11::string::~string((string *)&local_560);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_580,"rewrite-cond-br-to-same-branches",
                 (allocator<char> *)local_598);
      local_4a0[1] = (code *)0x0;
      local_4a0[0] = transform::rewriteCondBrToSameBranches;
      local_488 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
                  _M_invoke;
      local_490 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
                  _M_manager;
      PassManager::registerPass((PassManager *)&local_3c0,&local_580,(HandlerPass *)local_4a0);
      std::_Function_base::~_Function_base((_Function_base *)local_4a0);
      std::__cxx11::string::~string((string *)&local_580);
      PassManager::run((PassManager *)&local_3c0,(IRProgram *)local_598._8_8_);
      std::__cxx11::
      _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
      ::_M_clear((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
                  *)&local_3c0);
    }
    uVar1 = local_598._8_8_;
    local_598._8_8_ = (IRProgram *)0x0;
    std::__uniq_ptr_impl<flow::IRProgram,_std::default_delete<flow::IRProgram>_>::reset
              ((__uniq_ptr_impl<flow::IRProgram,_std::default_delete<flow::IRProgram>_> *)
               &this->programIR_,(pointer)uVar1);
    TargetCodeGenerator::TargetCodeGenerator(&local_3c0);
    TargetCodeGenerator::generate((TargetCodeGenerator *)local_598,(IRProgram *)&local_3c0);
    TargetCodeGenerator::~TargetCodeGenerator(&local_3c0);
    Program::link((Program *)local_598._0_8_,(char *)this,(char *)report);
    iVar2 = (*report->_vptr_Report[3])(report);
    uVar1 = local_598._0_8_;
    if ((byte)iVar2 == 0) {
      local_598._0_8_ = (__uniq_ptr_impl<flow::Program,_std::default_delete<flow::Program>_>)0x0;
      std::__uniq_ptr_impl<flow::Program,_std::default_delete<flow::Program>_>::reset
                ((__uniq_ptr_impl<flow::Program,_std::default_delete<flow::Program>_> *)
                 &this->program_,(pointer)uVar1);
      this->initialized_ = false;
    }
    bVar3 = (byte)iVar2 ^ 1;
    std::unique_ptr<flow::Program,_std::default_delete<flow::Program>_>::~unique_ptr
              ((unique_ptr<flow::Program,_std::default_delete<flow::Program>_> *)local_598);
    std::unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_>::~unique_ptr
              ((unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_> *)(local_598 + 8)
              );
    IRGenerator::~IRGenerator(&local_108);
  }
  else {
    bVar3 = 0;
  }
  if (local_588 != (pointer)0x0) {
    (**(code **)((local_588->_M_dataplus)._M_p + 8))();
  }
  return (bool)bVar3;
}

Assistant:

bool Interpreter::compile(Parser&& parser,
                          diagnostics::Report* report,
                          int optimizationLevel) {
  std::unique_ptr<flow::lang::UnitSym> unit = parser.parse();

  if (report->containsFailures())
    return false;

  IRGenerator irgen{report};
  std::unique_ptr<IRProgram> programIR = irgen.generate(unit.get());

  if (optimizationLevel > 0) {
    flow::PassManager pm;

    // mandatory passes
    pm.registerPass("eliminate-empty-blocks", &transform::emptyBlockElimination);

    // optional passes
    if (optimizationLevel >= 1) {
      pm.registerPass("eliminate-linear-br", &transform::eliminateLinearBr);
      pm.registerPass("eliminate-unused-blocks", &transform::eliminateUnusedBlocks);
      pm.registerPass("eliminate-unused-instr", &transform::eliminateUnusedInstr);
      pm.registerPass("fold-constant-condbr", &transform::foldConstantCondBr);
      pm.registerPass("rewrite-br-to-exit", &transform::rewriteBrToExit);
      pm.registerPass("rewrite-cond-br-to-same-branches", &transform::rewriteCondBrToSameBranches);
    }

    pm.run(programIR.get());
  }

  programIR_ = std::move(programIR);

  std::unique_ptr<Program> program = TargetCodeGenerator().generate(programIR_.get());
  program->link(this, report);
  if (report->containsFailures())
    return false;

  program_ = std::move(program);
  initialized_ = false;
  return true;
}